

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O3

void __thiscall
SAT::getLearntClause
          (SAT *this,int nodeid,set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  vec<int> *this_00;
  double *pdVar1;
  Lit *pLVar2;
  char *pcVar3;
  Reason *pRVar4;
  anon_union_8_2_743a5d44_for_Reason_0 aVar5;
  Reason RVar6;
  Clause *pCVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  ostream *poVar11;
  bool *pbVar12;
  anon_union_8_2_743a5d44_for_Reason_0 aVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 *puVar16;
  vec<Lit> *pvVar17;
  Lit n;
  uint uVar18;
  bool bVar19;
  Lit q;
  string local_98;
  int local_78;
  Lit local_74;
  vec<Lit> *local_70;
  anon_union_8_2_743a5d44_for_Reason_0 local_68;
  int local_5c;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_58;
  Heap<SAT::VarOrderLt> *local_50;
  vec<int> *local_48;
  vec<int> *local_40;
  vec<Lit> *local_38;
  undefined4 extraout_var;
  
  n.x = ::lit_Undef.x;
  local_5c = nodeid;
  local_58 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             contributingNogoods;
  uVar9 = findConflictLevel(this);
  aVar13 = (anon_union_8_2_743a5d44_for_Reason_0)this->confl;
  pvVar17 = (this->trail).data + uVar9;
  local_70 = pvVar17;
  if (so.debug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"trail of conflict level:",0x18);
    if (pvVar17->sz != 0) {
      uVar15 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        getLitString_abi_cxx11_(&local_98,pvVar17->data[uVar15].x);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p)
                   ,local_98._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p) !=
            &local_98.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p))
          ;
        }
        uVar15 = uVar15 + 1;
        pvVar17 = local_70;
      } while (uVar15 < local_70->sz);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  }
  this->index = pvVar17->sz;
  local_38 = &this->out_learnt;
  if ((this->out_learnt).data != (Lit *)0x0) {
    local_38->sz = 0;
  }
  this_00 = &this->out_learnt_level;
  if ((this->out_learnt_level).data != (int *)0x0) {
    this_00->sz = 0;
  }
  vec<Lit>::push(local_38);
  local_40 = this_00;
  vec<int>::push(this_00);
  local_50 = &this->order_heap;
  local_48 = &this->ivseen_toclear;
  local_68._pt = (Clause *)0x0;
  local_78 = 0;
  do {
    if ((*(uint *)aVar13._pt & 1) != 0) {
      uVar9 = *(uint *)aVar13._pt >> 8;
      (aVar13._pt)->data[uVar9].x = (int)((float)this->cla_inc + (float)(aVar13._pt)->data[uVar9].x)
      ;
      aVar13._pt[1].data[(ulong)uVar9 - 1].x = aVar13._pt[1].data[(ulong)uVar9 - 1].x + 1;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(local_58,&aVar13._pt[1].data[uVar9].x);
    }
    if (so.print_implications == true) {
      cVar8 = std::__basic_file<char>::is_open();
      if (cVar8 == '\0') {
        std::ofstream::open(implication_stream,0x1dcc39);
      }
      std::ostream::operator<<((ostream *)implication_stream,local_5c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream,",",1);
      if (n.x == ::lit_Undef.x) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream,"false",5);
      }
      else {
        getLitString_abi_cxx11_(&local_98,n.x);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)implication_stream,
                   (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p)
                   ,local_98._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p) !=
            &local_98.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p))
          ;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream,",",1);
      if ((uint)(n.x != ::lit_Undef.x) < *(uint *)aVar13._pt >> 8) {
        uVar15 = (ulong)(n.x != ::lit_Undef.x);
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream," ",1);
          if (*(uint *)aVar13._pt >> 8 <= uVar15) goto LAB_001c2945;
          getLitString_abi_cxx11_(&local_98,(aVar13._pt)->data[uVar15].x ^ 1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)implication_stream,
                     (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                      (uint)local_98._M_dataplus._M_p),local_98._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p) !=
              &local_98.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p
                                    ));
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < *(uint *)aVar13._pt >> 8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream,"\n",1);
    }
    uVar9 = *(uint *)aVar13._pt;
    if (so.debug == true) {
      if ((uVar9 & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"L",1);
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)&std::cerr,
                             ((Lit *)(aVar13._a + 0xc))[*(uint *)aVar13._pt >> 8].x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
      if (n.x == ::lit_Undef.x) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"false",5);
      }
      else {
        getLitString_abi_cxx11_(&local_98,n.x);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p)
                   ,local_98._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p) !=
            &local_98.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p))
          ;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  <-",4);
      if ((uint)(n.x != ::lit_Undef.x) < *(uint *)aVar13._pt >> 8) {
        uVar15 = (ulong)(n.x != ::lit_Undef.x);
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  \t",3);
          if (*(uint *)aVar13._pt >> 8 <= uVar15) goto LAB_001c2945;
          getLitString_abi_cxx11_(&local_98,(aVar13._pt)->data[uVar15].x ^ 1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                      (uint)local_98._M_dataplus._M_p),local_98._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p) !=
              &local_98.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p
                                    ));
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < *(uint *)aVar13._pt >> 8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      uVar9 = *(uint *)aVar13._pt;
    }
    if ((uint)(n.x != ::lit_Undef.x) < uVar9 >> 8) {
      uVar15 = (ulong)(n.x != ::lit_Undef.x);
      do {
        if (uVar9 >> 8 <= uVar15) {
LAB_001c2945:
          abort();
        }
        uVar9 = (aVar13._pt)->data[uVar15].x;
        uVar18 = (int)uVar9 >> 1;
        local_74.x = uVar9;
        if ((this->seen).data[uVar18] == '\0') {
          if (so.vsids == true) {
            pdVar1 = (this->activity).data;
            pdVar1[uVar18] = this->var_inc + pdVar1[uVar18];
            if (((int)uVar18 < (int)(this->order_heap).indices.sz) &&
               (-1 < (this->order_heap).indices.data[uVar18])) {
              Heap<SAT::VarOrderLt>::decrease(local_50,uVar18);
            }
            if (so.sat_polarity == 2) {
              pbVar12 = (this->polarity).data;
            }
            else {
              if (so.sat_polarity != 1) goto LAB_001c2552;
              pbVar12 = (this->polarity).data;
              uVar9 = (uint)(byte)~(byte)uVar9;
            }
            pbVar12[uVar18] = (bool)((byte)uVar9 & 1);
          }
LAB_001c2552:
          pvVar17 = local_70;
          uVar9 = *(uint *)((this->c_info).data + uVar18);
          if ((uVar9 & 0x60000000) == 0x20000000) {
            local_98._M_dataplus._M_p._0_4_ = uVar9 & 0x1fffffff;
            pbVar12 = (this->ivseen).data;
            if (pbVar12[(uint)local_98._M_dataplus._M_p] == false) {
              engine.vars.data[(uint)local_98._M_dataplus._M_p]->activity =
                   this->var_inc + engine.vars.data[(uint)local_98._M_dataplus._M_p]->activity;
              pbVar12[(uint)local_98._M_dataplus._M_p] = true;
              vec<int>::push(local_48,(int *)&local_98);
            }
          }
          (this->seen).data[uVar18] = '\x01';
          if ((this->trailpos).data[uVar18] < engine.trail_lim.data[engine.trail_lim.sz - 1]) {
            if (so.debug == true) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"added ",6);
              getLitString_abi_cxx11_(&local_98,local_74.x ^ 1);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                                    (uint)local_98._M_dataplus._M_p),
                                   local_98._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," to nogood\n",0xb);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p) !=
                  &local_98.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                         (uint)local_98._M_dataplus._M_p));
              }
            }
            vec<Lit>::push(local_38,&local_74);
            uVar14 = (ulong)engine.trail_lim.sz;
            iVar10 = engine.trail_lim.sz + 1;
            do {
              bVar19 = uVar14 == 0;
              uVar14 = uVar14 - 1;
              if (bVar19) {
                iVar10 = 0;
                break;
              }
              iVar10 = iVar10 + -1;
            } while ((this->trailpos).data[uVar18] < engine.trail_lim.data[uVar14]);
            local_98._M_dataplus._M_p._0_4_ = iVar10 - 1;
            if (iVar10 == 0) {
              local_98._M_dataplus._M_p._0_4_ = 0;
            }
            vec<int>::push(local_40,(int *)&local_98);
          }
          else {
            local_78 = local_78 + 1;
            if (so.debug == true) {
              getLitString_abi_cxx11_(&local_98,local_74.x ^ 1);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                                    (uint)local_98._M_dataplus._M_p),
                                   local_98._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11," is from current level; incremented pathC to ",0x2d);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,local_78);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              puVar16 = (undefined1 *)
                        CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar16 != &local_98.field_2) goto LAB_001c271f;
            }
          }
        }
        else {
          pvVar17 = local_70;
          if (so.debug == true) {
            getLitString_abi_cxx11_(&local_98,uVar9 ^ 1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                                  (uint)local_98._M_dataplus._M_p),
                                 local_98._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11," already marked as seen; skipping explanation\n",0x2e);
            puVar16 = (undefined1 *)
                      CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p);
            pvVar17 = local_70;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar16 != &local_98.field_2) {
LAB_001c271f:
              operator_delete(puVar16);
            }
          }
        }
        uVar15 = uVar15 + 1;
        uVar9 = *(uint *)aVar13._pt;
      } while (uVar15 < uVar9 >> 8);
    }
    while( true ) {
      pLVar2 = pvVar17->data;
      pcVar3 = (this->seen).data;
      uVar9 = this->index;
      do {
        uVar9 = uVar9 - 1;
        this->index = uVar9;
        n.x = pLVar2[uVar9].x;
        uVar18 = n.x >> 1;
      } while (pcVar3[uVar18] == '\0');
      pcVar3[uVar18] = '\0';
      if (so.debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"selected ",9);
        getLitString_abi_cxx11_(&local_98,n.x);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                              (uint)local_98._M_dataplus._M_p),
                             local_98._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11," as next literal to explain away\n",0x21);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p) !=
            &local_98.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_98._M_dataplus._M_p._4_4_,(uint)local_98._M_dataplus._M_p))
          ;
        }
      }
      local_78 = local_78 + -1;
      if ((local_78 == 0) && (((uint)(this->flags).data[uVar18] & 2) != 0)) {
        if (so.debug == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"one only literal left at current level; finished\n",0x31
                    );
        }
        ((this->out_learnt).data)->x = n.x ^ 1;
        *(this->out_learnt_level).data = (this->trail).sz - 2;
        return;
      }
      pRVar4 = (this->reason).data;
      aVar5 = (anon_union_8_2_743a5d44_for_Reason_0)pRVar4[uVar18].field_0._pt;
      if (local_68._pt != aVar5._pt) break;
      if (so.debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"same reason as previously explained literal; skipping\n",
                   0x36);
      }
    }
    uVar9 = (uint)aVar5._a & 3;
    aVar13 = aVar5;
    local_68 = aVar5;
    if ((aVar5._a & 3) != 0) {
      if (uVar9 == 1) {
        btToPos(this,this->index,(this->trailpos).data[uVar18]);
        RVar6.field_0 = (anon_union_8_2_743a5d44_for_Reason_0)(this->reason).data[uVar18].field_0._a
        ;
        aVar13._0_4_ = (*engine.propagators.data[(ulong)RVar6.field_0 >> 0x20]->_vptr_Propagator[5])
                                 (engine.propagators.data[(ulong)RVar6.field_0 >> 0x20],
                                  (ulong)(uint)n.x,(ulong)RVar6.field_0 >> 2 & 0x3fffffff);
        aVar13._a._4_4_ = extraout_var;
        local_68 = aVar5;
      }
      else {
        pCVar7 = this->short_expl;
        *(uint *)pCVar7 = uVar9 << 8 | (uint)*(byte *)pCVar7;
        *(uint *)(pCVar7 + 1) = *(uint *)&pRVar4[uVar18].field_0 >> 2;
        if (uVar9 == 3) {
          pCVar7[1].data[0].x = *(int *)((long)&pRVar4[uVar18].field_0 + 4);
        }
        aVar13 = (anon_union_8_2_743a5d44_for_Reason_0)this->short_expl;
      }
    }
  } while( true );
}

Assistant:

void SAT::getLearntClause(int nodeid, std::set<int>& contributingNogoods) {
	Lit p = lit_Undef;
	int pathC = 0;
	const int clevel = findConflictLevel();
	vec<Lit>& ctrail = trail[clevel];
	Clause* expl = confl;
	Reason last_reason = nullptr;

	if (so.debug) {
		std::cerr << "trail of conflict level:";
		for (unsigned int i = 0; i < ctrail.size(); i++) {
			std::cerr << " ";
			std::cerr << getLitString(toInt(ctrail[i]));
		}
		std::cerr << "\n";
	}

	index = ctrail.size();
	out_learnt.clear();
	out_learnt_level.clear();
	out_learnt.push();  // (leave room for the asserting literal)
	out_learnt_level.push();

	while (true) {
		assert(expl != nullptr);  // (otherwise should be UIP)
		Clause& c = *expl;

		if (PRINT_ANALYSIS) {
			if (p != lit_Undef) {
				c[0] = p;
			}
			printClause(c);
		}

		if (c.learnt) {
			c.activity() += static_cast<float>(cla_inc);
			c.rawActivity() += 1;
			contributingNogoods.insert(c.clauseID());
		}

		/* if (so.debug) { */
		/*   if (p == lit_Undef) { */
		/*     std::cerr << "explaining away failure (" << decisionLevel() << ")\n"; */
		/*   } else { */
		/*     std::cerr << "explaining away " << getLitString(toInt(p)) << " (lit number " << toInt(p)
		 * << ", level " << getLevel(var(p)) << ")\n"; */
		/*   } */
		/*   std::cerr << "expl:"; */
		/*   for (int i = (p == lit_Undef ? 0 : 1) ; i < c.size() ; i++) */
		/*     std::cerr << " " << getLitString(toInt(~c[i])); */
		/*   std::cerr << "\n"; */
		/* } */

		if (so.print_implications) {
			if (!implication_stream.is_open()) {
				implication_stream.open("implication-log.csv");
			}

			implication_stream << nodeid;
			implication_stream << ",";
			if (p == lit_Undef) {
				implication_stream << "false";
			} else {
				implication_stream << getLitString(toInt(p));
			}
			implication_stream << ",";
			for (unsigned int i = (p == lit_Undef ? 0 : 1); i < c.size(); i++) {
				implication_stream << " " << getLitString(toInt(~c[i]));
			}
			implication_stream << "\n";
		}

		if (so.debug) {
			if (c.learnt) {
				std::cerr << "L" << c.clauseID() << " ";
			}
			std::cerr << "\t";

			if (p == lit_Undef) {
				std::cerr << "false";
			} else {
				std::cerr << getLitString(toInt(p));
			}
			std::cerr << "  <-";
			for (unsigned int i = (p == lit_Undef ? 0 : 1); i < c.size(); i++) {
				std::cerr << "  \t" << getLitString(toInt(~c[i]));
			}
			std::cerr << "\n";
		}

		for (unsigned int j = (p == lit_Undef) ? 0 : 1; j < c.size(); j++) {
			const Lit q = c[j];
			const int x = var(q);
			/* if (so.debug) { */
			/*   std::cerr << "adding " << getLitString(toInt(~q)) << " (lit number " << toInt(~q) << ",
			 * var " << x << ") from level " << getLevel(x); */
			/* } */
			if (seen[x] == 0) {
				varBumpActivity(q);
				seen[x] = 1;
				if (isCurLevel(x)) {
					pathC++;
					if (so.debug) {
						std::cerr << getLitString(toInt(~q)) << " is from current level; incremented pathC to "
											<< pathC << "\n";
					}
				} else {
					if (so.debug) {
						std::cerr << "added " << getLitString(toInt(~q)) << " to nogood\n";
					}
					out_learnt.push(q);
					out_learnt_level.push(getLevel(x));
				}
			} else {
				if (so.debug) {
					//                            std::cerr << " but already seen this variable";
					std::cerr << getLitString(toInt(~q)) << " already marked as seen; skipping explanation\n";
				}
			}
			/* if (so.debug) { */
			/*   std::cerr << ", pathC is now " << pathC << "\n"; */
			/* } */
		}

	FindNextExpl:

		assert(pathC > 0);

		// Select next clause to look at:
		while (seen[var(ctrail[--index])] == 0) {
			;
		}
		assert(index >= 0);
		p = ctrail[index];
		seen[var(p)] = 0;
		pathC--;

		if (so.debug) {
			std::cerr << "selected " << getLitString(toInt(p)) << " as next literal to explain away\n";
		}

		if (pathC == 0 && flags[var(p)].uipable()) {
			if (so.debug) {
				std::cerr << "one only literal left at current level; finished\n";
			}
			break;
		}

		// This appears to be just an optimisation.
		if (last_reason == reason[var(p)]) {
			if (so.debug) {
				std::cerr << "same reason as previously explained literal; skipping\n";
			}
			goto FindNextExpl;
		}
		last_reason = reason[var(p)];
		expl = getExpl(p);
	}

	out_learnt[0] = ~p;
	out_learnt_level[0] = decisionLevel() - 1;
}